

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O0

SUNErrCode SUNNonlinSolInitialize_FixedPoint(SUNNonlinearSolver NLS)

{
  SUNContext sunctx_local_scope_;
  SUNNonlinearSolver NLS_local;
  
  *(undefined8 *)((long)NLS->content + 0x98) = 0;
  *(undefined8 *)((long)NLS->content + 0xa0) = 0;
  return 0;
}

Assistant:

SUNErrCode SUNNonlinSolInitialize_FixedPoint(SUNNonlinearSolver NLS)
{
  SUNFunctionBegin(NLS->sunctx);
  /* check that all required function pointers have been set */
  SUNAssert(FP_CONTENT(NLS)->Sys && FP_CONTENT(NLS)->CTest, SUN_ERR_ARG_CORRUPT);

  /* reset the total number of iterations and convergence failures */
  FP_CONTENT(NLS)->niters     = 0;
  FP_CONTENT(NLS)->nconvfails = 0;

  return SUN_SUCCESS;
}